

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAccount.cpp
# Opt level: O3

void __thiscall jbcoin::STAccount::STAccount(STAccount *this,SerialIter *sit,SField *name)

{
  undefined8 uVar1;
  uint8_t *local_30;
  size_t local_28;
  
  SerialIter::getVLDataLength(sit);
  SerialIter::getRawHelper<jbcoin::Buffer>((SerialIter *)&local_30,(int)sit);
  (this->super_STBase).fName = name;
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d2ef0;
  (this->value_).pn[0] = 0;
  (this->value_).pn[1] = 0;
  (this->value_).pn[2] = 0;
  (this->value_).pn[3] = 0;
  (this->value_).pn[4] = 0;
  this->default_ = true;
  if (local_28 == 0) {
    if (local_30 == (uint8_t *)0x0) {
      return;
    }
  }
  else {
    if (local_28 != 0x14) {
      Throw<std::runtime_error,char_const(&)[23]>((char (*) [23])"Invalid STAccount size");
    }
    this->default_ = false;
    (this->value_).pn[4] = *(uint32_t *)(local_30 + 0x10);
    uVar1 = *(undefined8 *)(local_30 + 8);
    *(undefined8 *)(this->value_).pn = *(undefined8 *)local_30;
    *(undefined8 *)((this->value_).pn + 2) = uVar1;
  }
  operator_delete__(local_30);
  return;
}

Assistant:

STAccount::STAccount (SerialIter& sit, SField const& name)
    : STAccount(name, sit.getVLBuffer())
{
}